

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,cmCustomCommandGenerator *ccg,cmGeneratorTarget *target,string *relative,
          bool echo_comment,ostream *content)

{
  pointer pcVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  TargetType targetType;
  char *pcVar6;
  size_t sVar7;
  string *psVar8;
  undefined4 extraout_var;
  long lVar9;
  long lVar10;
  cmValue cVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  ulong uVar13;
  ulong uVar14;
  char cVar15;
  undefined3 in_register_00000089;
  uint c;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string_view source;
  string_view source_00;
  string shellCommand;
  string launcher;
  string cmd;
  string dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string workingDir;
  string suffix;
  string local_2c0;
  string local_2a0;
  cmOutputConverter *local_280;
  string local_278;
  string local_258;
  cmRulePlaceholderExpander *local_238;
  cmGeneratorTarget *local_230;
  string local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  long *local_1f0;
  char *local_1e8;
  long local_1e0 [2];
  long *local_1d0;
  pointer local_1c8;
  long local_1c0 [2];
  string local_1b0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_190;
  string *local_188;
  undefined1 local_180 [24];
  char *local_168;
  char *local_160;
  long *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  
  local_230 = target;
  if (((CONCAT31(in_register_00000089,echo_comment) != 0) &&
      (pcVar6 = cmCustomCommandGenerator::GetComment(ccg), pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    local_180._0_8_ = local_180 + 0x10;
    sVar7 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_180,pcVar6,pcVar6 + sVar7);
    AppendEcho(this,commands,(string *)local_180,EchoGenerate,(EchoProgress *)0x0);
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
  }
  psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  pcVar1 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,pcVar1,pcVar1 + psVar8->_M_string_length);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&local_1b0,ccg);
  local_190 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
  local_188 = relative;
  if (local_1b0._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&local_228);
  }
  if (content != (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (content,local_228._M_dataplus._M_p,local_228._M_string_length);
  }
  iVar4 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                    (this);
  local_238 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar4);
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_280 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  c = 0;
  do {
    uVar5 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
    if (uVar5 <= c) {
      CreateCDCommand(this,&local_208,&local_228,local_188);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (local_190,*(undefined8 *)(local_190 + 8),
                 local_208.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_208.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_208);
      if (local_238 != (cmRulePlaceholderExpander *)0x0) {
        (*(local_238->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    cmCustomCommandGenerator::GetCommand_abi_cxx11_(&local_258,ccg,c);
    if (local_258._M_string_length != 0) {
      bVar3 = cmLocalGenerator::IsWindowsShell((cmLocalGenerator *)this);
      if (bVar3) {
        local_180._0_8_ = local_180 + 0x10;
        local_180._8_8_ = (long *)0x0;
        local_180._16_8_ = local_180._16_8_ & 0xffffffffffffff00;
        if (local_258._M_string_length < 5) {
LAB_0046ccfa:
          bVar3 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_2c0,(ulong)&local_258);
          cmsys::SystemTools::LowerCase(&local_2a0,&local_2c0);
          std::__cxx11::string::operator=((string *)local_180,(string *)&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,
                            CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                     local_2a0.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,
                            CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                                     local_2c0.field_2._M_local_buf[0]) + 1);
          }
          iVar4 = std::__cxx11::string::compare(local_180);
          if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare(local_180), iVar4 != 0))
          goto LAB_0046ccfa;
          bVar3 = true;
        }
        if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
          operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
        }
      }
      else {
        bVar3 = false;
      }
      cmsys::SystemTools::ReplaceString(&local_258,"/./","/");
      cVar15 = (char)&local_258;
      lVar9 = std::__cxx11::string::find(cVar15,0x2f);
      if (local_1b0._M_string_length == 0) {
        cmOutputConverter::MaybeRelativeToCurBinDir((string *)local_180,local_280,&local_258);
        std::__cxx11::string::operator=((string *)&local_258,(string *)local_180);
        if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
          operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
        }
      }
      lVar10 = std::__cxx11::string::find(cVar15,0x2f);
      if ((lVar9 != -1) && (lVar10 == -1)) {
        local_180._0_8_ = &DAT_00000002;
        local_180._8_8_ = "./";
        local_180._16_8_ = local_258._M_string_length;
        local_168 = local_258._M_dataplus._M_p;
        views._M_len = 2;
        views._M_array = (iterator)local_180;
        cmCatViews_abi_cxx11_(&local_2a0,views);
        std::__cxx11::string::operator=((string *)&local_258,(string *)&local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,
                          CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                   local_2a0.field_2._M_local_buf[0]) + 1);
        }
      }
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      local_2a0._M_string_length = 0;
      local_2a0.field_2._M_local_buf[0] = '\0';
      local_180._0_8_ = local_180 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"RULE_LAUNCH_CUSTOM","");
      cVar11 = cmLocalGenerator::GetRuleLauncher
                         ((cmLocalGenerator *)this,local_230,(string *)local_180);
      if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
        operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
      }
      if ((cVar11.Value != (string *)0x0) && ((cVar11.Value)->_M_string_length != 0)) {
        memset(local_180,0,0x150);
        psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(local_230);
        local_180._0_8_ = (psVar8->_M_dataplus)._M_p;
        targetType = cmGeneratorTarget::GetType(local_230);
        psVar8 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
        local_180._8_8_ = (psVar8->_M_dataplus)._M_p;
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        local_2c0._M_string_length = 0;
        local_2c0.field_2._M_local_buf[0] = '\0';
        pvVar12 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
        if ((pvVar12->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (pvVar12->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::_M_assign((string *)&local_2c0);
          if (local_1b0._M_string_length == 0) {
            cmOutputConverter::MaybeRelativeToCurBinDir(&local_278,local_280,&local_2c0);
            std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_278);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
          }
          source._M_str = local_2c0._M_dataplus._M_p;
          source._M_len = local_2c0._M_string_length;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_278,local_280,source,SHELL);
          std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_278);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
        }
        local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c0._M_dataplus._M_p;
        std::__cxx11::string::_M_assign((string *)&local_2a0);
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (local_238,local_280,&local_2a0,(RuleVariables *)local_180);
        if (local_2a0._M_string_length != 0) {
          std::__cxx11::string::append((char *)&local_2a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,
                          CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                                   local_2c0.field_2._M_local_buf[0]) + 1);
        }
      }
      MaybeConvertWatcomShellCommand(&local_2c0,this,&local_258);
      if (local_2c0._M_string_length == 0) {
        source_00._M_str = local_258._M_dataplus._M_p;
        source_00._M_len = local_258._M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  ((string *)local_180,local_280,source_00,SHELL);
        std::__cxx11::string::operator=((string *)&local_2c0,(string *)local_180);
        if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
          operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     &local_2a0,&local_2c0);
      std::__cxx11::string::operator=((string *)&local_258,(string *)local_180);
      if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
        operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
      }
      cmCustomCommandGenerator::AppendArguments(ccg,c,&local_258);
      if (content != (ostream *)0x0) {
        if (local_258._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear((int)content + (int)content->_vptr_basic_ostream[-3]);
        }
        else {
          pcVar6 = local_258._M_dataplus._M_p + local_2a0._M_string_length;
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(content,pcVar6,sVar7);
        }
      }
      if ((((this->BorlandMakeCurlyHack == true) &&
           (uVar13 = std::__cxx11::string::find(cVar15,0x7b), uVar13 != 0xffffffffffffffff)) &&
          (uVar13 < local_258._M_string_length - 1)) &&
         (uVar14 = std::__cxx11::string::find(cVar15,0x7d), uVar13 < uVar14)) {
        std::__cxx11::string::substr((ulong)&local_1d0,(ulong)&local_258);
        pcVar1 = local_1c8;
        plVar2 = local_1d0;
        std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&local_258);
        local_180._0_8_ = pcVar1;
        local_180._8_8_ = plVar2;
        local_180._16_8_ = 3;
        local_168 = "{{}";
        local_160 = local_1e8;
        local_158 = local_1f0;
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_180;
        cmCatViews_abi_cxx11_(&local_278,views_00);
        std::__cxx11::string::operator=((string *)&local_258,(string *)&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0,local_1e0[0] + 1);
        }
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0,local_1c0[0] + 1);
        }
      }
      if (local_2a0._M_string_length == 0) {
        if (bVar3) {
          local_180._0_8_ = (pointer)0x5;
          local_180._8_8_ = "call ";
          local_180._16_8_ = local_258._M_string_length;
          local_168 = local_258._M_dataplus._M_p;
          views_01._M_len = 2;
          views_01._M_array = (iterator)local_180;
          cmCatViews_abi_cxx11_(&local_278,views_01);
        }
        else {
          bVar3 = cmLocalGenerator::IsNMake((cmLocalGenerator *)this);
          if ((!bVar3) || (*local_258._M_dataplus._M_p != '\"')) goto LAB_0046d315;
          local_180._0_8_ = (pointer)0xd;
          local_180._8_8_ = "echo >nul && ";
          local_180._16_8_ = local_258._M_string_length;
          local_168 = local_258._M_dataplus._M_p;
          views_02._M_len = 2;
          views_02._M_array = (iterator)local_180;
          cmCatViews_abi_cxx11_(&local_278,views_02);
        }
        std::__cxx11::string::operator=((string *)&local_258,(string *)&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
      }
LAB_0046d315:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208,
                 &local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,
                        CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                                 local_2c0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,
                        CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                 local_2a0.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    c = c + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomCommand(
  std::vector<std::string>& commands, cmCustomCommandGenerator const& ccg,
  cmGeneratorTarget* target, std::string const& relative, bool echo_comment,
  std::ostream* content)
{
  // Optionally create a command to display the custom command's
  // comment text.  This is used for pre-build, pre-link, and
  // post-build command comments.  Custom build step commands have
  // their comments generated elsewhere.
  if (echo_comment) {
    const char* comment = ccg.GetComment();
    if (comment && *comment) {
      this->AppendEcho(commands, comment,
                       cmLocalUnixMakefileGenerator3::EchoGenerate);
    }
  }

  // if the command specified a working directory use it.
  std::string dir = this->GetCurrentBinaryDirectory();
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }
  if (content) {
    *content << dir;
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  // Add each command line to the set of commands.
  std::vector<std::string> commands1;
  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

      if (this->IsWindowsShell()) {
        std::string suffix;
        if (cmd.size() > 4) {
          suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
          if (suffix == ".bat" || suffix == ".cmd") {
            useCall = true;
          }
        }
      }

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd = this->MaybeRelativeToCurBinDir(cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = cmStrCat("./", cmd);
      }

      std::string launcher;
      // Short-circuit if there is no launcher.
      cmValue val = this->GetRuleLauncher(target, "RULE_LAUNCH_CUSTOM");
      if (cmNonempty(val)) {
        // Expand rule variables referenced in the given launcher command.
        cmRulePlaceholderExpander::RuleVariables vars;
        vars.CMTargetName = target->GetName().c_str();
        vars.CMTargetType =
          cmState::GetTargetTypeName(target->GetType()).c_str();
        std::string output;
        const std::vector<std::string>& outputs = ccg.GetOutputs();
        if (!outputs.empty()) {
          output = outputs[0];
          if (workingDir.empty()) {
            output = this->MaybeRelativeToCurBinDir(output);
          }
          output =
            this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
        }
        vars.Output = output.c_str();

        launcher = *val;
        rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
        if (!launcher.empty()) {
          launcher += " ";
        }
      }

      std::string shellCommand = this->MaybeConvertWatcomShellCommand(cmd);
      if (shellCommand.empty()) {
        shellCommand =
          this->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
      }
      cmd = launcher + shellCommand;

      ccg.AppendArguments(c, cmd);
      if (content) {
        // Rule content does not include the launcher.
        *content << (cmd.c_str() + launcher.size());
      }
      if (this->BorlandMakeCurlyHack) {
        // Borland Make has a very strange bug.  If the first curly
        // brace anywhere in the command string is a left curly, it
        // must be written {{} instead of just {.  Otherwise some
        // curly braces are removed.  The hack can be skipped if the
        // first curly brace is the last character.
        std::string::size_type lcurly = cmd.find('{');
        if (lcurly != std::string::npos && lcurly < (cmd.size() - 1)) {
          std::string::size_type rcurly = cmd.find('}');
          if (rcurly == std::string::npos || rcurly > lcurly) {
            // The first curly is a left curly.  Use the hack.
            cmd =
              cmStrCat(cmd.substr(0, lcurly), "{{}", cmd.substr(lcurly + 1));
          }
        }
      }
      if (launcher.empty()) {
        if (useCall) {
          cmd = cmStrCat("call ", cmd);
        } else if (this->IsNMake() && cmd[0] == '"') {
          cmd = cmStrCat("echo >nul && ", cmd);
        }
      }
      commands1.push_back(std::move(cmd));
    }
  }

  // Setup the proper working directory for the commands.
  this->CreateCDCommand(commands1, dir, relative);

  // push back the custom commands
  cm::append(commands, commands1);
}